

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_function.cpp
# Opt level: O2

spv_result_t spvtools::val::FunctionPass(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  pointer ppVar2;
  pointer pIVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint32_t uVar7;
  AddressingModel AVar8;
  StorageClass SVar9;
  uint uVar10;
  uint uVar11;
  uint32_t uVar12;
  Instruction *pIVar13;
  __normal_iterator<const_spv::Op_*,_std::vector<spv::Op,_std::allocator<spv::Op>_>_> _Var14;
  Instruction *pIVar15;
  Instruction *this;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar16;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar17;
  _Rb_tree_const_iterator<spvtools::val::Decoration> _Var18;
  _Base_ptr p_Var19;
  Instruction *lhs;
  Instruction *rhs;
  long lVar20;
  pointer this_00;
  undefined4 *puVar21;
  char *pcVar22;
  DiagnosticStream *pDVar23;
  ulong uVar24;
  pointer ppVar25;
  size_t sVar26;
  _Rb_tree_header *p_Var27;
  byte bVar28;
  string local_288;
  Instruction *local_268;
  uint local_25c;
  vector<spv::Op,_std::allocator<spv::Op>_> acceptable;
  DiagnosticStream local_208;
  
  bVar28 = 0;
  uVar1 = (inst->inst_).opcode;
  if (uVar1 == 0x14f9) {
    uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,3);
    pIVar13 = ValidationState_t::FindDef(_,uVar6);
    if ((pIVar13 == (Instruction *)0x0) || ((pIVar13->inst_).opcode != 0x36)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar22 = "OpCooperativeMatrixPerElementOpNV Function <id> ";
LAB_0055270c:
      std::operator<<((ostream *)&local_208,pcVar22);
      ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar6);
      std::operator<<((ostream *)&local_208,(string *)&local_288);
      pcVar22 = " is not a function.";
    }
    else {
      uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar15 = ValidationState_t::FindDef(_,uVar6);
      uVar7 = (pIVar15->inst_).type_id;
      bVar4 = ValidationState_t::IsCooperativeMatrixKHRType(_,uVar7);
      if (bVar4) {
        uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,0);
        if (uVar7 == uVar6) {
          pIVar15 = ValidationState_t::FindDef(_,uVar7);
          uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar15,1);
          uVar6 = Instruction::GetOperandAs<unsigned_int>(pIVar13,3);
          pIVar13 = ValidationState_t::FindDef(_,uVar6);
          uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar13,1);
          if (uVar10 == uVar7) {
            if ((ulong)((long)(pIVar13->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pIVar13->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_start) < 0x41) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::operator<<((ostream *)&local_208,
                              "OpCooperativeMatrixPerElementOpNV function type <id> ");
              ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar6);
              std::operator<<((ostream *)&local_208,(string *)&local_288);
              pcVar22 = " must have a least three parameters.";
LAB_0055265f:
              std::operator<<((ostream *)&local_208,pcVar22);
              std::__cxx11::string::_M_dispose();
              goto LAB_00552752;
            }
            uVar6 = Instruction::GetOperandAs<unsigned_int>(pIVar13,2);
            uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar13,3);
            uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar13,4);
            bVar4 = ValidationState_t::IsIntScalarType(_,uVar6);
            if ((bVar4) && (uVar12 = ValidationState_t::GetBitWidth(_,uVar6), uVar12 == 0x20)) {
              bVar4 = ValidationState_t::IsIntScalarType(_,uVar10);
              if ((!bVar4) || (uVar12 = ValidationState_t::GetBitWidth(_,uVar10), uVar12 != 0x20)) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::operator<<((ostream *)&local_208,
                                "OpCooperativeMatrixPerElementOpNV function type second parameter type <id> "
                               );
                ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar10);
                std::operator<<((ostream *)&local_208,(string *)&local_288);
                pcVar22 = " must be a 32-bit integer.";
                goto LAB_0055265f;
              }
              if (uVar11 == uVar7) {
                return SPV_SUCCESS;
              }
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::operator<<((ostream *)&local_208,
                              "OpCooperativeMatrixPerElementOpNV function type third parameter type <id> "
                             );
              ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar11);
              std::operator<<((ostream *)&local_208,(string *)&local_288);
              pcVar22 = " must match matrix component type.";
            }
            else {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::operator<<((ostream *)&local_208,
                              "OpCooperativeMatrixPerElementOpNV function type first parameter type <id> "
                             );
              ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar6);
              std::operator<<((ostream *)&local_208,(string *)&local_288);
              pcVar22 = " must be a 32-bit integer.";
            }
            goto LAB_00552738;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&local_208,
                          "OpCooperativeMatrixPerElementOpNV function return type <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar10);
          std::operator<<((ostream *)&local_208,(string *)&local_288);
          pcVar22 = " must match matrix component type <id> ";
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&local_208,
                          "OpCooperativeMatrixPerElementOpNV Result Type <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar6);
          std::operator<<((ostream *)&local_208,(string *)&local_288);
          pcVar22 = " must match matrix type <id> ";
        }
LAB_00552b43:
        std::operator<<((ostream *)&local_208,pcVar22);
        ValidationState_t::getIdName_abi_cxx11_((string *)&acceptable,_,uVar7);
        std::operator<<((ostream *)&local_208,(string *)&acceptable);
        pcVar22 = ".";
        goto LAB_00552b6f;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&local_208,"OpCooperativeMatrixPerElementOpNV Matrix <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar6);
      std::operator<<((ostream *)&local_208,(string *)&local_288);
      pcVar22 = " is not a cooperative matrix.";
    }
LAB_00552738:
    std::operator<<((ostream *)&local_208,pcVar22);
LAB_00552747:
    std::__cxx11::string::_M_dispose();
  }
  else {
    if (uVar1 != 0x37) {
      if (uVar1 != 0x39) {
        if (uVar1 != 0x36) {
          return SPV_SUCCESS;
        }
        uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,3);
        pIVar13 = ValidationState_t::FindDef(_,uVar6);
        if ((pIVar13 != (Instruction *)0x0) && ((pIVar13->inst_).opcode == 0x21)) {
          uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar13,1);
          if (uVar7 == (inst->inst_).type_id) {
            puVar21 = &DAT_007d478c;
            pDVar23 = &local_208;
            for (lVar20 = 0x11; lVar20 != 0; lVar20 = lVar20 + -1) {
              *(undefined4 *)pDVar23 = *puVar21;
              puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
              pDVar23 = (DiagnosticStream *)((long)pDVar23 + ((ulong)bVar28 * -2 + 1) * 4);
            }
            acceptable.super__Vector_base<spv::Op,_std::allocator<spv::Op>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            acceptable.super__Vector_base<spv::Op,_std::allocator<spv::Op>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            acceptable.super__Vector_base<spv::Op,_std::allocator<spv::Op>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<spv::Op,std::allocator<spv::Op>>::_M_range_initialize<spv::Op_const*>
                      ((vector<spv::Op,std::allocator<spv::Op>> *)&acceptable,&local_208,
                       &local_208.field_0x44);
            ppVar2 = (inst->uses_).
                     super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (ppVar25 = (inst->uses_).
                           super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; ppVar25 != ppVar2;
                ppVar25 = ppVar25 + 1) {
              pIVar13 = ppVar25->first;
              local_208._0_4_ = ZEXT24((pIVar13->inst_).opcode);
              _Var14 = std::
                       __find_if<__gnu_cxx::__normal_iterator<spv::Op_const*,std::vector<spv::Op,std::allocator<spv::Op>>>,__gnu_cxx::__ops::_Iter_equals_val<spv::Op_const>>
                                 (acceptable.super__Vector_base<spv::Op,_std::allocator<spv::Op>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  acceptable.super__Vector_base<spv::Op,_std::allocator<spv::Op>_>.
                                  _M_impl.super__Vector_impl_data._M_finish,&local_208);
              if (((_Var14._M_current ==
                    acceptable.super__Vector_base<spv::Op,_std::allocator<spv::Op>_>._M_impl.
                    super__Vector_impl_data._M_finish) &&
                  (bVar4 = Instruction::IsNonSemantic(pIVar13), !bVar4)) &&
                 (bVar4 = Instruction::IsDebugInfo(pIVar13), !bVar4)) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,pIVar13);
                std::operator<<((ostream *)&local_208,"Invalid use of function result id ");
                ValidationState_t::getIdName_abi_cxx11_(&local_288,_,(inst->inst_).result_id);
                std::operator<<((ostream *)&local_208,(string *)&local_288);
                std::operator<<((ostream *)&local_208,".");
                std::__cxx11::string::_M_dispose();
                DiagnosticStream::~DiagnosticStream(&local_208);
                goto LAB_00552a5b;
              }
            }
            local_208.error_ = SPV_SUCCESS;
LAB_00552a5b:
            std::_Vector_base<spv::Op,_std::allocator<spv::Op>_>::~_Vector_base
                      (&acceptable.super__Vector_base<spv::Op,_std::allocator<spv::Op>_>);
            goto LAB_00552757;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&local_208,"OpFunction Result Type <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_288,_,(inst->inst_).type_id);
          std::operator<<((ostream *)&local_208,(string *)&local_288);
          pcVar22 = " does not match the Function Type\'s return type <id> ";
          goto LAB_00552b43;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&local_208,"OpFunction Function Type <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar6);
        std::operator<<((ostream *)&local_208,(string *)&local_288);
        pcVar22 = " is not a function type.";
        goto LAB_00552738;
      }
      uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar13 = ValidationState_t::FindDef(_,uVar6);
      if ((pIVar13 == (Instruction *)0x0) || ((pIVar13->inst_).opcode != 0x36)) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar22 = "OpFunctionCall Function <id> ";
        goto LAB_0055270c;
      }
      pIVar15 = ValidationState_t::FindDef(_,(pIVar13->inst_).type_id);
      if ((pIVar15 != (Instruction *)0x0) && ((pIVar15->inst_).result_id == (inst->inst_).type_id))
      {
        uVar24 = 3;
        uVar6 = Instruction::GetOperandAs<unsigned_int>(pIVar13,3);
        pIVar13 = ValidationState_t::FindDef(_,uVar6);
        if ((pIVar13 == (Instruction *)0x0) || ((pIVar13->inst_).opcode != 0x21)) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar22 = "Missing function type definition.";
        }
        else {
          if ((long)(pIVar13->words_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pIVar13->words_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2 ==
              ((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2) + -1) {
            sVar26 = 2;
            while( true ) {
              if ((ulong)((long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar24) {
                return SPV_SUCCESS;
              }
              uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,uVar24);
              pIVar15 = ValidationState_t::FindDef(_,uVar6);
              if (pIVar15 == (Instruction *)0x0) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::operator<<((ostream *)&local_208,"Missing argument ");
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                pcVar22 = " definition.";
                goto LAB_00552adf;
              }
              local_268 = ValidationState_t::FindDef(_,(pIVar15->inst_).type_id);
              if (local_268 == (Instruction *)0x0) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::operator<<((ostream *)&local_208,"Missing argument ");
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                pcVar22 = " type definition.";
                goto LAB_00552adf;
              }
              local_25c = Instruction::GetOperandAs<unsigned_int>(pIVar13,sVar26);
              this = ValidationState_t::FindDef(_,local_25c);
              if (this == (Instruction *)0x0) break;
              uVar7 = (local_268->inst_).result_id;
              if (uVar7 != (this->inst_).result_id) {
                if (((_->options_->before_hlsl_legalization != true) ||
                    ((local_268->inst_).opcode != 0x20)) || ((this->inst_).opcode != 0x20)) break;
                psVar16 = ValidationState_t::id_decorations(_,uVar7);
                psVar17 = ValidationState_t::id_decorations(_,(this->inst_).result_id);
                p_Var27 = &(psVar16->_M_t)._M_impl.super__Rb_tree_header;
                for (p_Var19 = (psVar17->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                    (_Rb_tree_header *)p_Var19 != &(psVar17->_M_t)._M_impl.super__Rb_tree_header;
                    p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19)) {
                  _Var18 = std::
                           __find_if<std::_Rb_tree_const_iterator<spvtools::val::Decoration>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::val::Decoration_const>>
                                     ((psVar16->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                      _M_left,p_Var27,p_Var19 + 1);
                  if ((_Rb_tree_header *)_Var18._M_node == p_Var27) goto LAB_00552d47;
                }
                uVar10 = Instruction::GetOperandAs<unsigned_int>(local_268,2);
                uVar11 = Instruction::GetOperandAs<unsigned_int>(this,2);
                if (uVar10 != uVar11) {
                  lhs = ValidationState_t::FindDef(_,uVar10);
                  rhs = ValidationState_t::FindDef(_,uVar11);
                  bVar4 = ValidationState_t::LogicallyMatch(_,lhs,rhs,true);
                  if (!bVar4) break;
                }
              }
              AVar8 = ValidationState_t::addressing_model(_);
              if (((AVar8 == AddressingModelLogical) &&
                  ((uVar1 = (this->inst_).opcode, uVar1 == 0x1141 || (uVar1 == 0x20)))) &&
                 (_->options_->relax_logical_pointer == false)) {
                SVar9 = Instruction::GetOperandAs<spv::StorageClass>(this,1);
                if (StorageBuffer < SVar9) {
LAB_00552ef3:
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                  std::operator<<((ostream *)&local_208,"Invalid storage class for pointer operand "
                                 );
                  ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar6);
                  std::operator<<((ostream *)&local_208,(string *)&local_288);
                  goto LAB_00552747;
                }
                if ((0x4d1U >> (SVar9 & 0x1f) & 1) == 0) {
                  if (SVar9 != StorageBuffer) goto LAB_00552ef3;
                  if ((_->features_).variable_pointers == false) {
                    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                    std::operator<<((ostream *)&local_208,"StorageBuffer pointer operand ");
                    ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar6);
                    std::operator<<((ostream *)&local_208,(string *)&local_288);
                    pcVar22 = " requires a variable pointers capability";
                    goto LAB_00552738;
                  }
                }
                uVar1 = (pIVar15->inst_).opcode;
                if (((uVar1 != 0x37) && (uVar1 != 0x3b)) && (uVar1 != 0x1142)) {
                  bVar4 = EnumSet<spv::Capability>::contains
                                    (&_->module_capabilities_,
                                     CapabilityVariablePointersStorageBuffer);
                  bVar5 = EnumSet<spv::Capability>::contains
                                    (&_->module_capabilities_,CapabilityVariablePointers);
                  if ((((SVar9 != StorageClassUniformConstant) &&
                       (SVar9 != StorageClassWorkgroup || !bVar5)) &&
                      (SVar9 != StorageBuffer || !bVar4)) &&
                     (_->options_->before_hlsl_legalization == false)) {
                    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                    std::operator<<((ostream *)&local_208,"Pointer operand ");
                    ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar6);
                    std::operator<<((ostream *)&local_208,(string *)&local_288);
                    pcVar22 = " must be a memory object declaration";
                    goto LAB_00552738;
                  }
                }
              }
              uVar24 = uVar24 + 1;
              sVar26 = sVar26 + 1;
            }
LAB_00552d47:
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)&local_208,"OpFunctionCall Argument <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&local_288,_,uVar6);
            std::operator<<((ostream *)&local_208,(string *)&local_288);
            std::operator<<((ostream *)&local_208,"s type does not match Function <id> ");
            ValidationState_t::getIdName_abi_cxx11_((string *)&acceptable,_,local_25c);
            std::operator<<((ostream *)&local_208,(string *)&acceptable);
            pcVar22 = "s parameter type.";
            goto LAB_00552b6f;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar22 = 
          "OpFunctionCall Function <id>\'s parameter count does not match the argument count.";
        }
        goto LAB_00552adf;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&local_208,"OpFunctionCall Result Type <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_288,_,(inst->inst_).type_id);
      std::operator<<((ostream *)&local_208,(string *)&local_288);
      std::operator<<((ostream *)&local_208,"s type does not match Function <id> ");
      ValidationState_t::getIdName_abi_cxx11_((string *)&acceptable,_,(pIVar15->inst_).result_id);
      std::operator<<((ostream *)&local_208,(string *)&acceptable);
      pcVar22 = "s return type.";
LAB_00552b6f:
      std::operator<<((ostream *)&local_208,pcVar22);
      std::__cxx11::string::_M_dispose();
      goto LAB_00552747;
    }
    sVar26 = inst->line_num_;
    if (sVar26 == 1) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
      pcVar22 = "Function parameter cannot be the first instruction.";
LAB_00552adf:
      std::operator<<((ostream *)&local_208,pcVar22);
    }
    else {
      pIVar3 = (_->ordered_instructions_).
               super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_00 = pIVar3 + (sVar26 - 2);
      lVar20 = sVar26 - 2;
      uVar24 = 0;
      while (bVar4 = lVar20 != 0, lVar20 = lVar20 + -1, bVar4) {
        uVar1 = (this_00->inst_).opcode;
        if (uVar1 == 0x36) goto LAB_005527c8;
        uVar24 = uVar24 + (uVar1 == 0x37);
        this_00 = this_00 + -1;
      }
      this_00 = pIVar3 + 1;
      if (pIVar3[1].inst_.opcode != 0x36) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
        pcVar22 = "Function parameter must be preceded by a function.";
        goto LAB_00552adf;
      }
LAB_005527c8:
      uVar6 = Instruction::GetOperandAs<unsigned_int>(this_00,3);
      pIVar13 = ValidationState_t::FindDef(_,uVar6);
      if (pIVar13 == (Instruction *)0x0) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,this_00);
        std::operator<<((ostream *)&local_208,"Missing function type definition.");
      }
      else {
        if (uVar24 < ((long)(pIVar13->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(pIVar13->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) - 3U) {
          uVar6 = Instruction::GetOperandAs<unsigned_int>(pIVar13,uVar24 + 2);
          pIVar13 = ValidationState_t::FindDef(_,uVar6);
          if ((pIVar13 != (Instruction *)0x0) &&
             ((inst->inst_).type_id == (pIVar13->inst_).result_id)) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&local_208,"OpFunctionParameter Result Type <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_288,_,(inst->inst_).type_id);
          std::operator<<((ostream *)&local_208,(string *)&local_288);
          pcVar22 = " does not match the OpTypeFunction parameter type of the same index.";
          goto LAB_00552738;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&local_208,"Too many OpFunctionParameters for ");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        std::operator<<((ostream *)&local_208,": expected ");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        std::operator<<((ostream *)&local_208," based on the function\'s type");
      }
    }
  }
LAB_00552752:
  DiagnosticStream::~DiagnosticStream(&local_208);
LAB_00552757:
  if (local_208.error_ == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return local_208.error_;
}

Assistant:

spv_result_t FunctionPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpFunction:
      if (auto error = ValidateFunction(_, inst)) return error;
      break;
    case spv::Op::OpFunctionParameter:
      if (auto error = ValidateFunctionParameter(_, inst)) return error;
      break;
    case spv::Op::OpFunctionCall:
      if (auto error = ValidateFunctionCall(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixPerElementOpNV:
      if (auto error = ValidateCooperativeMatrixPerElementOp(_, inst))
        return error;
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}